

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void kj::(anonymous_namespace)::expectRes<kj::Array<unsigned_char>,4ul>
               (EncodingResult<kj::Array<unsigned_char>_> *result,byte (*expected) [4],bool errors)

{
  uchar *puVar1;
  ArrayDisposer *pAVar2;
  int iVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  ulong uVar5;
  CappedArray<char,_3UL> CVar6;
  unsigned_long i;
  CappedArray<char,_3UL> local_88;
  CappedArray<char,_3UL> local_78;
  ArrayDisposer *local_68;
  ulong local_60;
  uchar *local_58;
  ulong uStack_50;
  ArrayDisposer *local_48;
  byte local_40;
  
  puVar1 = (result->super_Array<unsigned_char>).ptr;
  uVar4 = (result->super_Array<unsigned_char>).size_;
  pAVar2 = (result->super_Array<unsigned_char>).disposer;
  (result->super_Array<unsigned_char>).ptr = (uchar *)0x0;
  (result->super_Array<unsigned_char>).size_ = 0;
  local_40 = result->hadErrors;
  local_58 = puVar1;
  uStack_50 = uVar4;
  local_48 = pAVar2;
  if ((int)CONCAT71(in_register_00000011,errors) == 0) {
    if ((local_40 & _::Debug::minSeverity < 3) == 1) {
      _::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x2d,ERROR,"\"failed: expected \" \"!result.hadErrors\"",
                 (char (*) [35])"failed: expected !result.hadErrors");
    }
  }
  else if ((bool)local_40 == false && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x2b,ERROR,"\"failed: expected \" \"result.hadErrors\"",
               (char (*) [34])"failed: expected result.hadErrors");
  }
  if ((uVar4 != 4) && (_::Debug::minSeverity < 3)) {
    local_88.currentSize = 4;
    local_78.currentSize = uVar4;
    _::Debug::log<char_const(&)[50],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"result.size() == expected.size()\", result.size(), expected.size()"
               ,(char (*) [50])"failed: expected result.size() == expected.size()",
               &local_78.currentSize,&local_88.currentSize);
  }
  uVar5 = 4;
  if (uVar4 < 4) {
    uVar5 = uVar4;
  }
  local_68 = pAVar2;
  local_60 = uVar4;
  if (uVar4 == 0) {
    if (puVar1 == (uchar *)0x0) {
      return;
    }
  }
  else {
    uVar4 = 0;
    iVar3 = _::Debug::minSeverity;
    do {
      i = uVar4;
      if ((puVar1[uVar4] != (*expected)[uVar4]) && (iVar3 < 3)) {
        CVar6 = hex(puVar1[uVar4]);
        local_78.currentSize = CVar6.currentSize;
        local_78.content._0_2_ = CVar6.content._0_2_;
        local_78.content[2] = CVar6.content[2];
        CVar6 = hex((*expected)[i]);
        local_88.currentSize = CVar6.currentSize;
        local_88.content._0_2_ = CVar6.content._0_2_;
        local_88.content[2] = CVar6.content[2];
        _::Debug::
        log<char_const(&)[42],unsigned_long&,kj::CappedArray<char,3ul>,kj::CappedArray<char,3ul>>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                   ,0x32,ERROR,
                   "\"failed: expected \" \"result[i] == expected[i]\", i, hex(result[i]), hex(expected[i])"
                   ,(char (*) [42])"failed: expected result[i] == expected[i]",&i,&local_78,
                   &local_88);
        iVar3 = _::Debug::minSeverity;
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  local_58 = (uchar *)0x0;
  uStack_50 = 0;
  (**local_68->_vptr_ArrayDisposer)(local_68,puVar1,1,local_60,local_60,0);
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               byte (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr<const byte>(expected, s), errors);
}